

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O1

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Sample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,DSPOMDP *model)

{
  pointer *pppSVar1;
  pointer ppSVar2;
  iterator __position;
  pointer ppSVar3;
  State *pSVar4;
  int iVar5;
  undefined4 extraout_var;
  log_ostream *plVar6;
  ostream *poVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  double max;
  double dVar14;
  State *particle;
  State *local_38;
  
  max = 1.0 / (double)num;
  dVar13 = Random::NextDouble((Random *)&Random::RANDOM,0.0,max);
  dVar14 = (*(particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
             _M_impl.super__Vector_impl_data._M_start)->weight;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (0 < num) {
    iVar10 = 0;
    iVar9 = 0;
    do {
      if (dVar14 < dVar13) {
        ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          iVar10 = iVar10 + 1;
          if ((long)(particles->
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3 == (long)iVar10) {
            iVar10 = 0;
          }
          dVar14 = dVar14 + ppSVar2[iVar10]->weight;
        } while (dVar14 < dVar13);
      }
      iVar5 = (*model->_vptr_DSPOMDP[0x16])
                        (model,(particles->
                               super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[iVar10]);
      local_38 = (State *)CONCAT44(extraout_var,iVar5);
      local_38->weight = max;
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<despot::State*,std::allocator<despot::State*>>::
        _M_realloc_insert<despot::State*const&>
                  ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__,
                   __position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppSVar1 = &(__return_storage_ptr__->
                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppSVar1 = *pppSVar1 + 1;
      }
      dVar13 = dVar13 + max;
      iVar9 = iVar9 + 1;
    } while (iVar9 != num);
  }
  ppSVar2 = (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar3 = (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if ((ppSVar2 != ppSVar3) && (ppSVar2 + 1 != ppSVar3)) {
    lVar11 = 8;
    do {
      iVar9 = rand();
      lVar8 = (long)iVar9 % ((lVar11 >> 3) + 1);
      if (lVar11 != lVar8 * 8) {
        pSVar4 = *(State **)((long)ppSVar2 + lVar11);
        *(State **)((long)ppSVar2 + lVar11) = ppSVar2[lVar8];
        ppSVar2[lVar8] = pSVar4;
      }
      lVar8 = lVar11 + 8;
      lVar11 = lVar11 + 8;
    } while ((pointer)((long)ppSVar2 + lVar8) != ppSVar3);
  }
  iVar9 = logging::level();
  if (0 < iVar9) {
    iVar9 = logging::level();
    if (3 < iVar9) {
      plVar6 = logging::stream(4);
      std::__ostream_insert<char,std::char_traits<char>>
                (&plVar6->super_ostream,"[ParticleBelief::Sample] Sampled ",0x21);
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)plVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," particles",10);
      std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
    }
  }
  if ((__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      iVar9 = logging::level();
      if (0 < iVar9) {
        iVar9 = logging::level();
        if (4 < iVar9) {
          plVar6 = logging::stream(5);
          std::__ostream_insert<char,std::char_traits<char>>(&plVar6->super_ostream," ",1);
          poVar7 = (ostream *)std::ostream::operator<<(plVar6,(int)uVar12);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          poVar7 = despot::operator<<(poVar7,(__return_storage_ptr__->
                                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar12]);
          std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Sample(int num, vector<State*> particles,
	const DSPOMDP* model) {

	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = particles[0]->weight;
	vector<State*> sample;
	for (int i = 0; i < num; i++) {
		while (mass > cur) {
			pos++;
			if (pos == particles.size())
				pos = 0;

			cur += particles[pos]->weight;
		}

		mass += unit;

		State* particle = model->Copy(particles[pos]);
		particle->weight = unit;
		sample.push_back(particle);
	}

	random_shuffle(sample.begin(), sample.end());

	logd << "[ParticleBelief::Sample] Sampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}